

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBox.h
# Opt level: O0

Vec4<long> * __thiscall
Imath_3_2::Box<Imath_3_2::Vec4<long>_>::center(Box<Imath_3_2::Vec4<long>_> *this)

{
  Vec4<long> *in_RDI;
  long in_stack_ffffffffffffffd0;
  Vec4<long> *in_stack_ffffffffffffffd8;
  
  Vec4<long>::operator+(in_RDI,in_RDI);
  Vec4<long>::operator/(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  return in_RDI;
}

Assistant:

IMATH_HOSTDEVICE constexpr inline V
Box<V>::center () const IMATH_NOEXCEPT
{
    return (max + min) / 2;
}